

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<short>::test_one<(libdivide::Branching)1>
          (DivideTest<short> *this,short numer,short denom,
          divider<short,_(libdivide::Branching)1> *the_divider)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  short *in_RCX;
  short in_DX;
  short in_SI;
  short result;
  short expect;
  uint16_t q_sign;
  uint16_t is_power_of_2;
  int16_t q;
  int16_t magic;
  int16_t sign;
  uint8_t shift;
  uint8_t more;
  int32_t rl;
  int32_t yl;
  int32_t xl;
  int in_stack_ffffffffffffff64;
  DivideTest<short> *in_stack_ffffffffffffff68;
  
  sVar2 = std::numeric_limits<short>::min();
  if ((in_SI != sVar2) || (in_DX != -1)) {
    bVar1 = *(byte *)(in_RCX + 1) & 0x1f;
    uVar3 = (ushort)((int)(char)*(byte *)(in_RCX + 1) >> 7);
    sVar2 = (short)((uint)((int)in_SI * (int)*in_RCX) >> 0x10) + in_SI;
    sVar2 = ((ushort)((int)(short)(sVar2 + (sVar2 >> 0xf &
                                           (short)(1 << bVar1) - (ushort)(*in_RCX == 0))) >> bVar1)
            ^ uVar3) - uVar3;
    if (sVar2 != in_SI / in_DX) {
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      std::operator<<((ostream *)&std::cerr,(string *)&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,in_SI);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,in_DX);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,in_SI / in_DX);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,sVar2);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }